

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O2

Error * libsbox::run_together
                  (Error *__return_storage_ptr__,
                  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *tasks,
                  string *socket_path)

{
  undefined8 *puVar1;
  Task *this;
  bool bVar2;
  int iVar3;
  uint uVar4;
  SizeType SVar5;
  Ch *__s;
  ssize_t sVar6;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar7;
  char *pcVar8;
  Type pGVar9;
  long lVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  Ch *pCVar11;
  long lVar12;
  size_t __n;
  undefined8 *puVar13;
  string *this_00;
  vector<libsbox::Task_*,_std::allocator<libsbox::Task_*>_> *__range1;
  ulong uVar14;
  fd_t socket_fd;
  allocator<char> local_5e9;
  Data local_5e8 [2];
  Document document;
  shared_ptr<int> ptr;
  string message;
  string res;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_518;
  Stack<rapidjson::CrtAllocator> local_4d8;
  __allocator_type __a2;
  char local_4a4 [108];
  char buf [1024];
  
  local_518.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_4d8;
  local_4d8.stack_ = (char *)0x0;
  local_4d8.stackTop_ = (char *)0x0;
  local_4d8.stackEnd_ = (char *)0x0;
  local_4d8.allocator_ = (CrtAllocator *)0x0;
  local_4d8.ownAllocator_ = (CrtAllocator *)0x0;
  local_4d8.initialCapacity_ = 0x100;
  local_518.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_518.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_518.level_stack_.stackEnd_ = (char *)0x0;
  local_518.level_stack_.stack_ = (char *)0x0;
  local_518.level_stack_.stackTop_ = (char *)0x0;
  local_518.level_stack_.initialCapacity_ = 0x200;
  local_518.maxDecimalPlaces_ = 0x144;
  local_518.hasRoot_ = false;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_518);
  buf._0_8_ = anon_var_dwarf_7e9d;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_518,(Ch **)buf);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(&local_518);
  puVar1 = *(undefined8 **)(tasks + 8);
  for (puVar13 = *(undefined8 **)tasks; puVar13 != puVar1; puVar13 = puVar13 + 1) {
    Task::
    serialize_request<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((Task *)*puVar13,&local_518);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(&local_518,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_518,0);
  __s = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                  ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_4d8
                  );
  std::__cxx11::string::string<std::allocator<char>>((string *)&message,__s,(allocator<char> *)buf);
  socket_fd = socket(1,1,0);
  if (socket_fd < 0) {
    format_abi_cxx11_((string *)buf,"Cannot create socket: %m");
    Error::Error(__return_storage_ptr__,(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    goto LAB_00139270;
  }
  ptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &socket_fd;
  ptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  buf._0_8_ = &__a2;
  (ptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count = 1;
  (ptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count = 1;
  (ptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00166200;
  ptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&socket_fd;
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<int_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/src/libsbox.cpp:512:43),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<int_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Forestryks[P]libsbox_src_libsbox_cpp:512:43),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)buf);
  local_4a4[0x60] = '\0';
  local_4a4[0x61] = '\0';
  local_4a4[0x62] = '\0';
  local_4a4[99] = '\0';
  local_4a4[100] = '\0';
  local_4a4[0x65] = '\0';
  local_4a4[0x66] = '\0';
  local_4a4[0x67] = '\0';
  local_4a4[0x68] = '\0';
  local_4a4[0x69] = '\0';
  local_4a4[0x6a] = '\0';
  local_4a4[0x6b] = '\0';
  local_4a4[0x50] = '\0';
  local_4a4[0x51] = '\0';
  local_4a4[0x52] = '\0';
  local_4a4[0x53] = '\0';
  local_4a4[0x54] = '\0';
  local_4a4[0x55] = '\0';
  local_4a4[0x56] = '\0';
  local_4a4[0x57] = '\0';
  local_4a4[0x58] = '\0';
  local_4a4[0x59] = '\0';
  local_4a4[0x5a] = '\0';
  local_4a4[0x5b] = '\0';
  local_4a4[0x5c] = '\0';
  local_4a4[0x5d] = '\0';
  local_4a4[0x5e] = '\0';
  local_4a4[0x5f] = '\0';
  local_4a4[0x40] = '\0';
  local_4a4[0x41] = '\0';
  local_4a4[0x42] = '\0';
  local_4a4[0x43] = '\0';
  local_4a4[0x44] = '\0';
  local_4a4[0x45] = '\0';
  local_4a4[0x46] = '\0';
  local_4a4[0x47] = '\0';
  local_4a4[0x48] = '\0';
  local_4a4[0x49] = '\0';
  local_4a4[0x4a] = '\0';
  local_4a4[0x4b] = '\0';
  local_4a4[0x4c] = '\0';
  local_4a4[0x4d] = '\0';
  local_4a4[0x4e] = '\0';
  local_4a4[0x4f] = '\0';
  local_4a4[0x30] = '\0';
  local_4a4[0x31] = '\0';
  local_4a4[0x32] = '\0';
  local_4a4[0x33] = '\0';
  local_4a4[0x34] = '\0';
  local_4a4[0x35] = '\0';
  local_4a4[0x36] = '\0';
  local_4a4[0x37] = '\0';
  local_4a4[0x38] = '\0';
  local_4a4[0x39] = '\0';
  local_4a4[0x3a] = '\0';
  local_4a4[0x3b] = '\0';
  local_4a4[0x3c] = '\0';
  local_4a4[0x3d] = '\0';
  local_4a4[0x3e] = '\0';
  local_4a4[0x3f] = '\0';
  local_4a4[0x20] = '\0';
  local_4a4[0x21] = '\0';
  local_4a4[0x22] = '\0';
  local_4a4[0x23] = '\0';
  local_4a4[0x24] = '\0';
  local_4a4[0x25] = '\0';
  local_4a4[0x26] = '\0';
  local_4a4[0x27] = '\0';
  local_4a4[0x28] = '\0';
  local_4a4[0x29] = '\0';
  local_4a4[0x2a] = '\0';
  local_4a4[0x2b] = '\0';
  local_4a4[0x2c] = '\0';
  local_4a4[0x2d] = '\0';
  local_4a4[0x2e] = '\0';
  local_4a4[0x2f] = '\0';
  local_4a4[0x10] = '\0';
  local_4a4[0x11] = '\0';
  local_4a4[0x12] = '\0';
  local_4a4[0x13] = '\0';
  local_4a4[0x14] = '\0';
  local_4a4[0x15] = '\0';
  local_4a4[0x16] = '\0';
  local_4a4[0x17] = '\0';
  local_4a4[0x18] = '\0';
  local_4a4[0x19] = '\0';
  local_4a4[0x1a] = '\0';
  local_4a4[0x1b] = '\0';
  local_4a4[0x1c] = '\0';
  local_4a4[0x1d] = '\0';
  local_4a4[0x1e] = '\0';
  local_4a4[0x1f] = '\0';
  local_4a4[0] = '\0';
  local_4a4[1] = '\0';
  local_4a4[2] = '\0';
  local_4a4[3] = '\0';
  local_4a4[4] = '\0';
  local_4a4[5] = '\0';
  local_4a4[6] = '\0';
  local_4a4[7] = '\0';
  local_4a4[8] = '\0';
  local_4a4[9] = '\0';
  local_4a4[10] = '\0';
  local_4a4[0xb] = '\0';
  local_4a4[0xc] = '\0';
  local_4a4[0xd] = '\0';
  local_4a4[0xe] = '\0';
  local_4a4[0xf] = '\0';
  ___a2 = 1;
  __n = 0x6b;
  if (socket_path->_M_string_length < 0x6b) {
    __n = socket_path->_M_string_length;
  }
  strncpy(local_4a4,(socket_path->_M_dataplus)._M_p,__n);
  iVar3 = connect(socket_fd,(sockaddr *)&__a2,0x6e);
  if (iVar3 == 0) {
    sVar6 = send(socket_fd,message._M_dataplus._M_p,message._M_string_length + 1,0);
    if ((-1 < (int)(uint)sVar6) &&
       ((ulong)((uint)sVar6 & 0x7fffffff) == message._M_string_length + 1)) {
      res._M_dataplus._M_p = (pointer)&res.field_2;
      res._M_string_length = 0;
      res.field_2._M_local_buf[0] = '\0';
      while( true ) {
        sVar6 = recv(socket_fd,buf,0x3ff,0);
        uVar4 = (uint)sVar6;
        if ((int)uVar4 < 0) break;
        if (uVar4 == 0) {
          if (run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
              ::response_validator == '\0') {
            iVar3 = __cxa_guard_acquire(&run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
                                         ::response_validator);
            if (iVar3 != 0) {
              SchemaValidator::SchemaValidator
                        (&run_together::response_validator,response_schema_data);
              __cxa_atexit(SchemaValidator::~SchemaValidator,&run_together::response_validator,
                           &__dso_handle);
              __cxa_guard_release(&run_together(std::vector<libsbox::Task*,std::allocator<libsbox::Task*>>const&,std::__cxx11::string_const&)
                                   ::response_validator);
            }
          }
          SchemaValidator::get_error_abi_cxx11_
                    ((string *)&document,&run_together::response_validator);
          std::__cxx11::string::~string((string *)&document);
          if (document.
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              .data_.s.str != (Ch *)0x0) {
            SchemaValidator::get_error_abi_cxx11_
                      ((string *)&document,&run_together::response_validator);
            Error::Error(__return_storage_ptr__,(string *)&document);
            goto LAB_00139324;
          }
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GenericDocument(&document,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                            (CrtAllocator *)0x0);
          pGVar7 = rapidjson::
                   GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                   ::Parse<0u,rapidjson::UTF8<char>>
                             ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                               *)&document,res._M_dataplus._M_p);
          if ((pGVar7->parseResult_).code_ == kParseErrorNone) {
            bVar2 = SchemaValidator::validate(&run_together::response_validator,&document);
            if (bVar2) {
              bVar2 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::HasMember(&document.
                                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  ,"error");
              if (bVar2) {
                pGVar9 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>
                                   ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     *)&document,"error");
                if ((undefined1  [16])
                    ((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x400000000000000) !=
                    (undefined1  [16])0x0) {
                  pGVar9 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>
                                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       *)&document,"error");
                  pCVar11 = rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::GetString(pGVar9);
                  format_abi_cxx11_((string *)&local_5e8[0].s,"[remote] %s",pCVar11);
                  Error::Error(__return_storage_ptr__,(string *)&local_5e8[0].s);
                  goto LAB_00139522;
                }
              }
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)&document,"tasks");
              rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_5e8[0].s);
              SVar5 = rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::Size((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)local_5e8[0]._0_8_);
              lVar10 = *(long *)tasks;
              lVar12 = *(long *)(tasks + 8);
              if (lVar12 - lVar10 >> 3 == (ulong)SVar5) {
                uVar14 = 0;
                goto LAB_0013943e;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_5e8[0].s,
                         "Response JSON object \'tasks\' array size is not equal to tasks count",
                         &local_5e9);
              Error::Error(__return_storage_ptr__,(string *)&local_5e8[0].s);
            }
            else {
              SchemaValidator::get_error_abi_cxx11_
                        ((string *)&local_5e8[0].s,&run_together::response_validator);
              Error::Error(__return_storage_ptr__,(string *)&local_5e8[0].s);
            }
          }
          else {
            pcVar8 = rapidjson::GetParseError_En(document.parseResult_.code_);
            format_abi_cxx11_((string *)&local_5e8[0].s,"Cannot parse response (offset %zi): %s",
                              document.parseResult_.offset_,pcVar8);
            Error::Error(__return_storage_ptr__,(string *)&local_5e8[0].s);
          }
LAB_00139522:
          std::__cxx11::string::~string((string *)&local_5e8[0].s);
          goto LAB_0013952c;
        }
        buf[uVar4 & 0x7fffffff] = '\0';
        std::__cxx11::string::append((char *)&res);
      }
      format_abi_cxx11_((string *)&document,"Cannot receive response: %m");
      Error::Error(__return_storage_ptr__,(string *)&document);
LAB_00139324:
      std::__cxx11::string::~string((string *)&document);
      goto LAB_0013932e;
    }
    format_abi_cxx11_((string *)buf,"Cannot send request: %m");
    Error::Error(__return_storage_ptr__,(string *)buf);
  }
  else {
    format_abi_cxx11_((string *)buf,"Cannot connect to socket: %m");
    Error::Error(__return_storage_ptr__,(string *)buf);
  }
  this_00 = (string *)buf;
  goto LAB_00139263;
LAB_0013943e:
  if ((ulong)(lVar12 - lVar10 >> 3) <= uVar14) goto LAB_0013953b;
  this = *(Task **)(lVar10 + uVar14 * 8);
  pGVar9 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)&document,"tasks");
  value = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::operator[](pGVar9,(SizeType)uVar14);
  Task::
  deserialize_response<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (__return_storage_ptr__,this,value);
  bVar2 = Error::operator_cast_to_bool(__return_storage_ptr__);
  if (bVar2) goto LAB_0013952c;
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  uVar14 = uVar14 + 1;
  lVar10 = *(long *)tasks;
  lVar12 = *(long *)(tasks + 8);
  goto LAB_0013943e;
LAB_0013953b:
  (__return_storage_ptr__->error_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->error_).field_2 + 8) = 0;
  (__return_storage_ptr__->error_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_).field_2;
  (__return_storage_ptr__->error_)._M_string_length = 0;
LAB_0013952c:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&document);
LAB_0013932e:
  this_00 = &res;
LAB_00139263:
  std::__cxx11::string::~string((string *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00139270:
  std::__cxx11::string::~string((string *)&message);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_518.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_4d8);
  return __return_storage_ptr__;
}

Assistant:

Error libsbox::run_together(const std::vector<Task *> &tasks, const std::string &socket_path) {
    rapidjson::StringBuffer buffer;
    rapidjson::Writer<rapidjson::StringBuffer> writer(buffer);
    writer.StartObject();
    writer.Key("tasks");
    writer.StartArray();
    for (auto task : tasks) {
        task->serialize_request(writer);
    }
    writer.EndArray();
    writer.EndObject();

    std::string message = buffer.GetString();

    fd_t socket_fd = socket(AF_UNIX, SOCK_STREAM, 0);
    if (socket_fd < 0) {
        return Error(format("Cannot create socket: %m"));
    }

    std::shared_ptr<fd_t> ptr(&socket_fd, [](const fd_t *fd) { close(*fd); });

    sockaddr_un addr{};
    addr.sun_family = AF_UNIX;
    strncpy(addr.sun_path, socket_path.c_str(), std::min(sizeof(addr.sun_path) - 1, socket_path.size()));

    int status = connect(socket_fd, reinterpret_cast<const struct sockaddr *>(&addr), sizeof(struct sockaddr_un));
    if (status != 0) {
        return Error(format("Cannot connect to socket: %m"));
    }

    int cnt = send(socket_fd, message.c_str(), message.size() + 1, 0);
    if (cnt < 0 || static_cast<size_t>(cnt) != message.size() + 1) {
        return Error(format("Cannot send request: %m"));
    }

    std::string res;
    char buf[1024];
    while (true) {
        cnt = recv(socket_fd, buf, 1023, 0);
        if (cnt < 0) {
            return Error(format("Cannot receive response: %m"));
        }
        if (cnt == 0) {
            break;
        }
        buf[cnt] = 0;
        res += buf;
    }

    static SchemaValidator response_validator(response_schema_data);
    if (!response_validator.get_error().empty()) {
        return Error(response_validator.get_error());
    }

    rapidjson::Document document;
    if (document.Parse(res.c_str()).HasParseError()) {
        return Error(
            format(
                "Cannot parse response (offset %zi): %s",
                document.GetErrorOffset(),
                rapidjson::GetParseError_En(document.GetParseError())
            )
        );
    }

    if (!response_validator.validate(document)) {
        return Error(response_validator.get_error());
    }

    if (document.HasMember("error") && document["error"].IsString()) {
        return Error(format("[remote] %s", document["error"].GetString()));
    }

    if (document["tasks"].GetArray().Size() != tasks.size()) {
        return Error("Response JSON object 'tasks' array size is not equal to tasks count");
    }

    for (size_t i = 0; i < tasks.size(); ++i) {
        auto error = tasks[i]->deserialize_response(document["tasks"][i]);
        if (error) {
            return error;
        }
    }

    return Error();
}